

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::findNodeOfSize(MemoryAccountant *this,size_t size)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *pMVar2;
  
  pMVar2 = this->head_;
  if (this->useCacheSizes_ == false) {
    if (pMVar2 == (MemoryAccountantAllocationNode *)0x0) {
      return (MemoryAccountantAllocationNode *)0x0;
    }
    pMVar1 = (MemoryAccountantAllocationNode *)0x0;
    do {
      if (pMVar2->size_ == size) {
        return pMVar2;
      }
      pMVar2 = pMVar2->next_;
    } while (pMVar2 != (MemoryAccountantAllocationNode *)0x0);
  }
  else {
    if (pMVar2 == (MemoryAccountantAllocationNode *)0x0) {
      return (MemoryAccountantAllocationNode *)0x0;
    }
    do {
      while (pMVar1 = pMVar2, pMVar2 = pMVar1->next_, size <= pMVar1->size_) {
        if (size <= pMVar2->size_ - 1) {
          return pMVar1;
        }
      }
    } while (pMVar2 != (MemoryAccountantAllocationNode *)0x0);
  }
  return pMVar1;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::findNodeOfSize(size_t size) const
{
    if (useCacheSizes_) {
        for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_) {
            if (((size > node->size_) && (node->next_ == NULLPTR))
                || ((size <= node->size_) &&
                    !((node->next_->size_ != 0) && (node->next_->size_ <= size))))
                return node;
        }
    }
    else
        for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_)
            if (node->size_ == size)
                return node;
    return NULLPTR;
}